

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

bool __thiscall
ON_PlaneSurface::GetBBox(ON_PlaneSurface *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  bool bVar1;
  long lVar2;
  ON_3dPoint *pOVar3;
  long lVar4;
  long lVar5;
  ON_3dPoint local_b0;
  ON_3dPoint corner [4];
  
  lVar2 = 0;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    pOVar3 = corner + (int)lVar2;
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      ON_Surface::PointAt(&local_b0,&this->super_ON_Surface,
                          *(double *)(&this->field_0x90 + lVar4 * 8),
                          *(double *)(&this->field_0xa0 + lVar5 * 8));
      pOVar3->z = local_b0.z;
      pOVar3->x = local_b0.x;
      pOVar3->y = local_b0.y;
      pOVar3 = pOVar3 + 1;
    }
    lVar2 = (long)(int)lVar2 + 2;
  }
  bVar1 = ON_GetPointListBoundingBox(3,false,4,3,&corner[0].x,boxmin,boxmax,(uint)bGrowBox);
  return bVar1;
}

Assistant:

bool ON_PlaneSurface::GetBBox( // returns true if successful
         double* boxmin,    // minimum
         double* boxmax,    // maximum
         bool bGrowBox
         ) const
{
  int i,j,k=0;
  ON_3dPoint corner[4];
  for ( i = 0; i < 2; i++ ) for ( j = 0; j < 2; j++ ) {
    corner[k++] = PointAt( m_domain[0].m_t[i], m_domain[1].m_t[j] );
  }
  return ON_GetPointListBoundingBox( 3, 0, 4, 3, 
                                     &corner[0].x, 
                                     boxmin, 
                                     boxmax, bGrowBox?true:false );
}